

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O2

void round_shift_16bit_w16_avx2(__m256i *in,int size,int bit)

{
  byte bVar1;
  undefined1 auVar2 [32];
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [32];
  
  if (bit < 0) {
    bVar1 = ~(byte)bit & 0x1f;
    auVar6._0_2_ = (undefined2)(1 << bVar1);
    auVar6._2_2_ = auVar6._0_2_;
    auVar6._4_2_ = auVar6._0_2_;
    auVar6._6_2_ = auVar6._0_2_;
    auVar6._8_2_ = auVar6._0_2_;
    auVar6._10_2_ = auVar6._0_2_;
    auVar6._12_2_ = auVar6._0_2_;
    auVar6._14_2_ = auVar6._0_2_;
    auVar6._16_2_ = auVar6._0_2_;
    auVar6._18_2_ = auVar6._0_2_;
    auVar6._20_2_ = auVar6._0_2_;
    auVar6._22_2_ = auVar6._0_2_;
    auVar6._24_2_ = auVar6._0_2_;
    auVar6._26_2_ = auVar6._0_2_;
    auVar6._28_2_ = auVar6._0_2_;
    auVar6._30_2_ = auVar6._0_2_;
    uVar3 = 0 << bVar1;
    uVar4 = (ulong)uVar3;
    uVar5 = (ulong)(uint)size;
    if (size < 1) {
      uVar5 = (ulong)uVar3;
    }
    for (; uVar5 * 0x20 != uVar4; uVar4 = uVar4 + 0x20) {
      auVar2 = vpaddsw_avx2(auVar6,*(undefined1 (*) [32])((long)*in + uVar4));
      auVar2 = vpsraw_avx2(auVar2,ZEXT416((uint)-bit));
      *(undefined1 (*) [32])((long)*in + uVar4) = auVar2;
    }
  }
  else if (bit != 0) {
    uVar4 = 0;
    uVar5 = (ulong)(uint)size;
    if (size < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 * 0x20 != uVar4; uVar4 = uVar4 + 0x20) {
      auVar6 = vpsllw_avx2(*(undefined1 (*) [32])((long)*in + uVar4),ZEXT416((uint)bit));
      *(undefined1 (*) [32])((long)*in + uVar4) = auVar6;
    }
  }
  return;
}

Assistant:

static inline void round_shift_16bit_w16_avx2(__m256i *in, int size, int bit) {
  if (bit < 0) {
    bit = -bit;
    __m256i round = _mm256_set1_epi16(1 << (bit - 1));
    for (int i = 0; i < size; ++i) {
      in[i] = _mm256_adds_epi16(in[i], round);
      in[i] = _mm256_srai_epi16(in[i], bit);
    }
  } else if (bit > 0) {
    for (int i = 0; i < size; ++i) {
      in[i] = _mm256_slli_epi16(in[i], bit);
    }
  }
}